

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O3

void Saig_SynchTernaryTransferState(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  iVar6 = pAig->nRegs;
  if (0 < iVar6) {
    pVVar2 = pAig->vCos;
    iVar5 = 0;
    do {
      uVar7 = pAig->nTruePos + iVar5;
      if (((((int)uVar7 < 0) || (pVVar2->nSize <= (int)uVar7)) ||
          (uVar8 = pAig->nTruePis + iVar5, (int)uVar8 < 0)) || (pAig->vCis->nSize <= (int)uVar8)) {
LAB_006f82d8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar1 = *(int *)((long)pVVar2->pArray[uVar7] + 0x24);
      if (((long)iVar1 < 0) || (vSimInfo->nSize <= iVar1)) goto LAB_006f82d8;
      uVar7 = *(uint *)((long)pAig->vCis->pArray[uVar8] + 0x24);
      if (((long)(int)uVar7 < 0) || ((uint)vSimInfo->nSize <= uVar7)) goto LAB_006f82d8;
      if (0 < nWords) {
        pvVar3 = vSimInfo->pArray[iVar1];
        pvVar4 = vSimInfo->pArray[(int)uVar7];
        uVar9 = 0;
        do {
          *(undefined4 *)((long)pvVar4 + uVar9 * 4) = *(undefined4 *)((long)pvVar3 + uVar9 * 4);
          uVar9 = uVar9 + 1;
        } while ((uint)nWords != uVar9);
        iVar6 = pAig->nRegs;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar6);
  }
  return;
}

Assistant:

void Saig_SynchTernaryTransferState( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    unsigned * pSim0, * pSim1;
    int i, w;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim1[w] = pSim0[w];
    }
}